

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-array.hpp
# Opt level: O2

void __thiscall baryonyx::fixed_array<int>::fixed_array(fixed_array<int> *this,fixed_array<int> *o)

{
  uint uVar1;
  
  std::make_unique<int[]>((size_t)this);
  uVar1 = o->m_length;
  this->m_length = uVar1;
  if ((ulong)uVar1 != 0) {
    memmove((this->m_buffer)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl,
            (o->m_buffer)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl,(ulong)uVar1 << 2);
    return;
  }
  return;
}

Assistant:

fixed_array<T>::fixed_array(const fixed_array& o)
  : m_buffer{ std::make_unique<T[]>(o.m_length) }
  , m_length{ o.m_length }
{
    std::copy_n(o.data(), o.size(), data());
}